

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

Instr * __thiscall BackwardPass::TryChangeInstrForStackArgOpt(BackwardPass *this)

{
  Instr *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  Opnd *dstOpnd;
  StackSym *pSVar5;
  RegOpnd *newDst;
  Instr *instr;
  
  this_00 = this->currentInstr;
  if (((this->tag == DeadStorePhase) && (bVar2 = IR::Instr::DoStackArgsOpt(this_00), bVar2)) &&
     (this_00->m_opcode == TypeofElem)) {
    if (((this_00->field_0x38 & 0x10) == 0) ||
       (BVar3 = IR::Instr::GetBailOutKind(this_00), (BVar3 >> 0x14 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1079,
                         "(instr->HasBailOutInfo() && (instr->GetBailOutKind() & IR::BailOutKind::BailOnStackArgsOutOfActualsRange))"
                         ,"Why is the bailout kind not set, when it is StackArgOptimized?");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    this_00->m_opcode = LdElemI_A;
    dstOpnd = IR::Instr::UnlinkDst(this_00);
    pSVar5 = StackSym::New(this_00->m_func);
    newDst = IR::RegOpnd::New(pSVar5,TyVar,this_00->m_func);
    IR::Instr::SetDst(this_00,&newDst->super_Opnd);
    instr = IR::Instr::New(Typeof,dstOpnd,&newDst->super_Opnd,this_00->m_func);
    IR::Instr::InsertAfter(this_00,instr);
    return instr;
  }
  if ((this->tag == BackwardPhase) &&
     (pSVar5 = Func::GetScopeObjSym(this_00->m_func), pSVar5 != (StackSym *)0x0)) {
    this_01 = this->currentBlock->upwardExposedUses;
    pSVar5 = Func::GetScopeObjSym(this_00->m_func);
    BVSparse<Memory::JitArenaAllocator>::Set(this_01,(pSVar5->super_Sym).m_id);
  }
  return (Instr *)0x0;
}

Assistant:

IR::Instr *
BackwardPass::TryChangeInstrForStackArgOpt()
{
    IR::Instr * instr = this->currentInstr;
    if (tag == Js::DeadStorePhase && instr->DoStackArgsOpt())
    {
        switch (instr->m_opcode)
        {
            case Js::OpCode::TypeofElem:
            {
                /*
                    Before:
                        dst = TypeOfElem arguments[i] <(BailOnStackArgsOutOfActualsRange)>

                    After:
                        tmpdst = LdElemI_A arguments[i] <(BailOnStackArgsOutOfActualsRange)>
                        dst = TypeOf tmpdst
                */

                AssertMsg(instr->HasBailOutInfo() && (instr->GetBailOutKind() & IR::BailOutKind::BailOnStackArgsOutOfActualsRange), "Why is the bailout kind not set, when it is StackArgOptimized?");

                instr->m_opcode = Js::OpCode::LdElemI_A;
                IR::Opnd * dstOpnd = instr->UnlinkDst();

                IR::RegOpnd * elementOpnd = IR::RegOpnd::New(StackSym::New(instr->m_func), IRType::TyVar, instr->m_func);
                instr->SetDst(elementOpnd);

                IR::Instr * typeOfInstr = IR::Instr::New(Js::OpCode::Typeof, dstOpnd, elementOpnd, instr->m_func);
                instr->InsertAfter(typeOfInstr);

                return typeOfInstr;
            }
        }
    }

    /*
    *   Scope Object Sym is kept alive in all code paths.
    *   -This is to facilitate Bailout to record the live Scope object Sym, whenever required.
    *   -Reason for doing is this because - Scope object has to be implicitly live whenever Heap Arguments object is live.
    *   -When we restore HeapArguments object in the bail out path, it expects the scope object also to be restored - if one was created.
    *   -We do not know detailed information about Heap arguments obj syms(aliasing etc.) until we complete Forward Pass.
    *   -And we want to avoid dead sym clean up (in this case, scope object though not explicitly live, it is live implicitly) during Block merging in the forward pass.
    *   -Hence this is the optimal spot to do this.
    */

    if (tag == Js::BackwardPhase && instr->m_func->GetScopeObjSym() != nullptr)
    {
        this->currentBlock->upwardExposedUses->Set(instr->m_func->GetScopeObjSym()->m_id);
    }

    return nullptr;
}